

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestGetTemplate(void)

{
  uint __line;
  Template *tpl;
  Template *pTVar1;
  Template *tpl_00;
  long lVar2;
  char *__assertion;
  allocator local_151;
  undefined1 local_150 [32];
  TemplateCache cache2;
  string filename;
  TemplateCache cache1;
  TemplateDictionary empty_dict;
  
  ctemplate::TemplateCache::TemplateCache(&cache1);
  ctemplate::TemplateString::TemplateString((TemplateString *)&cache2,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&empty_dict,(TemplateString *)&cache2,(UnsafeArena *)0x0);
  std::__cxx11::string::string
            ((string *)&cache2,"{This is perfectly valid} yay!",(allocator *)local_150);
  ctemplate::StringToTemplateFile(&filename,(string *)&cache2);
  std::__cxx11::string::~string((string *)&cache2);
  _cache2 = filename._M_dataplus._M_p;
  tpl = (Template *)ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&cache2);
  ctemplate::TemplateString::TemplateString((TemplateString *)&cache2,filename._M_dataplus._M_p);
  pTVar1 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&cache2);
  _cache2 = filename._M_dataplus._M_p;
  tpl_00 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&cache2);
  if (((tpl == (Template *)0x0) || (pTVar1 == (Template *)0x0)) || (tpl_00 == (Template *)0x0)) {
    __assertion = "tpl1 && tpl2 && tpl3";
    __line = 0x60;
  }
  else if (tpl == pTVar1) {
    if (tpl == tpl_00) {
      __assertion = "tpl1 != tpl3";
      __line = 0x62;
    }
    else {
      std::__cxx11::string::string
                ((string *)&cache2,"{This is perfectly valid} yay!",(allocator *)local_150);
      ctemplate::AssertExpandIs(tpl,&empty_dict,(string *)&cache2,true);
      std::__cxx11::string::~string((string *)&cache2);
      std::__cxx11::string::string
                ((string *)&cache2,"{This is perfectly valid} yay!",(allocator *)local_150);
      ctemplate::AssertExpandIs(pTVar1,&empty_dict,(string *)&cache2,true);
      std::__cxx11::string::~string((string *)&cache2);
      std::__cxx11::string::string
                ((string *)&cache2,"{This is perfectly valid} yay!",(allocator *)local_150);
      ctemplate::AssertExpandIs(tpl_00,&empty_dict,(string *)&cache2,true);
      std::__cxx11::string::~string((string *)&cache2);
      ctemplate::TemplateString::TemplateString((TemplateString *)&cache2,"/yakakak");
      lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&cache2);
      if (lVar2 == 0) {
        ctemplate::TemplateCache::TemplateCache(&cache2);
        local_150._0_8_ = filename._M_dataplus._M_p;
        local_150._8_8_ = filename._M_string_length;
        local_150[0x10] = '\0';
        local_150._24_8_ = 0;
        pTVar1 = (Template *)
                 ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache2,(Strip)local_150);
        if (pTVar1 == (Template *)0x0) {
          __assertion = "tpl5";
          __line = 0x6e;
        }
        else if (pTVar1 == tpl) {
          __assertion = "tpl5 != tpl1";
          __line = 0x6f;
        }
        else {
          std::__cxx11::string::string
                    ((string *)local_150,"{This is perfectly valid} yay!",&local_151);
          ctemplate::AssertExpandIs(pTVar1,&empty_dict,(string *)local_150,true);
          std::__cxx11::string::~string((string *)local_150);
          local_150._0_8_ = filename._M_dataplus._M_p;
          local_150._8_8_ = filename._M_string_length;
          local_150[0x10] = '\0';
          local_150._24_8_ = 0;
          pTVar1 = (Template *)
                   ctemplate::Template::GetTemplate((TemplateString *)local_150,DO_NOT_STRIP);
          if (pTVar1 == (Template *)0x0) {
            __assertion = "tpl6";
            __line = 0x74;
          }
          else {
            if (pTVar1 != tpl) {
              std::__cxx11::string::string
                        ((string *)local_150,"{This is perfectly valid} yay!",&local_151);
              ctemplate::AssertExpandIs(pTVar1,&empty_dict,(string *)local_150,true);
              std::__cxx11::string::~string((string *)local_150);
              ctemplate::TemplateCache::~TemplateCache(&cache2);
              std::__cxx11::string::~string((string *)&filename);
              ctemplate::TemplateDictionary::~TemplateDictionary(&empty_dict);
              ctemplate::TemplateCache::~TemplateCache(&cache1);
              return;
            }
            __assertion = "tpl6 != tpl1";
            __line = 0x75;
          }
        }
      }
      else {
        __assertion = "!tpl4";
        __line = 0x69;
      }
    }
  }
  else {
    __assertion = "tpl1 == tpl2";
    __line = 0x61;
  }
  printf("ASSERT FAILED, line %d: %s\n",(ulong)__line,__assertion);
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                ,__line,"static void TemplateCacheUnittest::TestGetTemplate()");
}

Assistant:

static void TestGetTemplate() {
    // Tests the cache
    TemplateCache cache1;
    const char* text = "{This is perfectly valid} yay!";
    TemplateDictionary empty_dict("dict");

    string filename = StringToTemplateFile(text);
    const Template* tpl1 = cache1.GetTemplate(filename, DO_NOT_STRIP);
    const Template* tpl2 = cache1.GetTemplate(filename.c_str(), DO_NOT_STRIP);
    const Template* tpl3 = cache1.GetTemplate(filename, STRIP_WHITESPACE);
    ASSERT(tpl1 && tpl2 && tpl3);
    ASSERT(tpl1 == tpl2);
    ASSERT(tpl1 != tpl3);
    AssertExpandIs(tpl1, &empty_dict, text, true);
    AssertExpandIs(tpl2, &empty_dict, text, true);
    AssertExpandIs(tpl3, &empty_dict, text, true);

    // Tests that a nonexistent template returns NULL
    const Template* tpl4 = cache1.GetTemplate("/yakakak", STRIP_WHITESPACE);
    ASSERT(!tpl4);

    // Make sure we get different results if we use a different cache.
    TemplateCache cache2;
    const Template* tpl5 = cache2.GetTemplate(filename, DO_NOT_STRIP);
    ASSERT(tpl5);
    ASSERT(tpl5 != tpl1);
    AssertExpandIs(tpl5, &empty_dict, text, true);

    // And different results yet if we use the default cache.
    const Template* tpl6 = Template::GetTemplate(filename, DO_NOT_STRIP);
    ASSERT(tpl6);
    ASSERT(tpl6 != tpl1);
    AssertExpandIs(tpl6, &empty_dict, text, true);
  }